

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void __thiscall amrex::ParmParse::add(ParmParse *this,char *name,IntVect *val)

{
  char *in_RSI;
  IntVect *in_stack_00000198;
  string *in_stack_000001a0;
  allocator local_59;
  string local_58 [32];
  string *in_stack_ffffffffffffffc8;
  ParmParse *in_stack_ffffffffffffffd0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,in_RSI,&local_59);
  prefixedName(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  anon_unknown_12::anon_unknown_0::saddval<amrex::IntVect>(in_stack_000001a0,in_stack_00000198);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return;
}

Assistant:

void
ParmParse::add (const char* name,
                const IntVect&  val)
{
    saddval(prefixedName(name),val);
}